

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxConnectMethod
              (sqlite3 *db,void *pUnused,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  int iVar1;
  size_t sVar2;
  sqlite3_uint64 n;
  sqlite3_vtab *__s;
  Fts3auxTable *p;
  int rc;
  sqlite3_int64 nByte;
  int nFts3;
  int nDb;
  char *zFts3;
  char *zDb;
  char **pzErr_local;
  sqlite3_vtab **ppVtab_local;
  char **argv_local;
  int argc_local;
  void *pUnused_local;
  sqlite3 *db_local;
  
  if ((argc == 4) || (argc == 5)) {
    zFts3 = argv[1];
    sVar2 = strlen(zFts3);
    nByte._4_4_ = (int)sVar2;
    if (argc == 5) {
      if ((nByte._4_4_ != 4) || (iVar1 = sqlite3_strnicmp("temp",zFts3,4), iVar1 != 0))
      goto LAB_001f3379;
      zFts3 = argv[3];
      sVar2 = strlen(zFts3);
      nByte._4_4_ = (int)sVar2;
      _nFts3 = argv[4];
    }
    else {
      _nFts3 = argv[3];
    }
    sVar2 = strlen(_nFts3);
    db_local._4_4_ =
         sqlite3_declare_vtab
                   (db,"CREATE TABLE x(term, col, documents, occurrences, languageid HIDDEN)");
    if (db_local._4_4_ == 0) {
      n = (long)nByte._4_4_ + (long)(int)sVar2 + 0x22a;
      __s = (sqlite3_vtab *)sqlite3_malloc64(n);
      if (__s == (sqlite3_vtab *)0x0) {
        db_local._4_4_ = 7;
      }
      else {
        memset(__s,0,n);
        __s[1].pModule = (sqlite3_module *)&__s[1].nRef;
        (__s[1].pModule)->xDisconnect = (_func_int_sqlite3_vtab_ptr *)&__s[1].pModule[2].xRollback;
        (__s[1].pModule)->xDestroy = (__s[1].pModule)->xDisconnect + (nByte._4_4_ + 1);
        (__s[1].pModule)->xBestIndex = (_func_int_sqlite3_vtab_ptr_sqlite3_index_info_ptr *)db;
        *(undefined4 *)&__s[1].pModule[2].xRowid = 1;
        memcpy((__s[1].pModule)->xDisconnect,zFts3,(long)nByte._4_4_);
        memcpy((__s[1].pModule)->xDestroy,_nFts3,(long)(int)sVar2);
        sqlite3Fts3Dequote((char *)(__s[1].pModule)->xDestroy);
        *ppVtab = __s;
        db_local._4_4_ = 0;
      }
    }
  }
  else {
LAB_001f3379:
    sqlite3Fts3ErrMsg(pzErr,"invalid arguments to fts4aux constructor");
    db_local._4_4_ = 1;
  }
  return db_local._4_4_;
}

Assistant:

static int fts3auxConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pUnused,                  /* Unused */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  char const *zDb;                /* Name of database (e.g. "main") */
  char const *zFts3;              /* Name of fts3 table */
  int nDb;                        /* Result of strlen(zDb) */
  int nFts3;                      /* Result of strlen(zFts3) */
  sqlite3_int64 nByte;            /* Bytes of space to allocate here */
  int rc;                         /* value returned by declare_vtab() */
  Fts3auxTable *p;                /* Virtual table object to return */

  UNUSED_PARAMETER(pUnused);

  /* The user should invoke this in one of two forms:
  **
  **     CREATE VIRTUAL TABLE xxx USING fts4aux(fts4-table);
  **     CREATE VIRTUAL TABLE xxx USING fts4aux(fts4-table-db, fts4-table);
  */
  if( argc!=4 && argc!=5 ) goto bad_args;

  zDb = argv[1]; 
  nDb = (int)strlen(zDb);
  if( argc==5 ){
    if( nDb==4 && 0==sqlite3_strnicmp("temp", zDb, 4) ){
      zDb = argv[3]; 
      nDb = (int)strlen(zDb);
      zFts3 = argv[4];
    }else{
      goto bad_args;
    }
  }else{
    zFts3 = argv[3];
  }
  nFts3 = (int)strlen(zFts3);

  rc = sqlite3_declare_vtab(db, FTS3_AUX_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nByte = sizeof(Fts3auxTable) + sizeof(Fts3Table) + nDb + nFts3 + 2;
  p = (Fts3auxTable *)sqlite3_malloc64(nByte);
  if( !p ) return SQLITE_NOMEM;
  memset(p, 0, nByte);

  p->pFts3Tab = (Fts3Table *)&p[1];
  p->pFts3Tab->zDb = (char *)&p->pFts3Tab[1];
  p->pFts3Tab->zName = &p->pFts3Tab->zDb[nDb+1];
  p->pFts3Tab->db = db;
  p->pFts3Tab->nIndex = 1;

  memcpy((char *)p->pFts3Tab->zDb, zDb, nDb);
  memcpy((char *)p->pFts3Tab->zName, zFts3, nFts3);
  sqlite3Fts3Dequote((char *)p->pFts3Tab->zName);

  *ppVtab = (sqlite3_vtab *)p;
  return SQLITE_OK;

 bad_args:
  sqlite3Fts3ErrMsg(pzErr, "invalid arguments to fts4aux constructor");
  return SQLITE_ERROR;
}